

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::LinearDerivateCase::verify
          (LinearDerivateCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  tcu *this_00;
  Precision PVar1;
  int iVar2;
  TestLog *pTVar3;
  MessageBuilder *pMVar4;
  undefined7 extraout_var;
  float *pfVar5;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined7 uVar6;
  Vec4 *pVVar7;
  Vec4 *a;
  bool bVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float *local_788;
  float local_77c;
  Vector<float,_4> local_770;
  undefined1 local_760 [8];
  Vec4 threshold_1;
  Vec4 local_740;
  undefined1 local_730 [8];
  Vec4 dyThreshold;
  Vec4 local_710;
  undefined1 local_700 [8];
  Vec4 dxThreshold;
  Vector<float,_4> local_6e0;
  undefined1 local_6d0 [8];
  Vec4 reference_1;
  Vector<float,_4> local_6b0;
  undefined1 local_6a0 [8];
  Vec4 dy;
  Vector<float,_4> local_680;
  undefined1 local_670 [8];
  Vec4 dx;
  float h_1;
  float w_1;
  Vector<float,_3> local_64c;
  Vector<float,_3> local_640;
  Vector<float,_3> local_634;
  Vector<float,_3> local_628;
  Vector<float,_3> local_61c;
  undefined1 local_610 [8];
  Linear2DFunctionEvaluator function;
  Vec4 valueRamp;
  float h;
  float w;
  IVec2 viewportSize;
  MessageBuilder local_440;
  LogVecComps local_2c0;
  LogVecComps local_2b0 [2];
  MessageBuilder local_290;
  DataType local_10c;
  undefined1 local_108 [4];
  int numComps;
  Vec4 threshold;
  tcu local_e8 [16];
  Functional local_d8 [8];
  Vec4 opThreshold;
  tcu local_b8 [16];
  undefined1 local_a8 [8];
  Vec4 reference;
  Vec4 scale;
  float div;
  bool isX;
  undefined1 local_70 [24];
  Vec4 surfaceThreshold;
  Vec4 yScale;
  Vec4 xScale;
  PixelBufferAccess *errorMask_local;
  ConstPixelBufferAccess *result_local;
  LinearDerivateCase *this_local;
  
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(yScale.m_data + 2),1.0,0.0,0.5,-0.5);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(surfaceThreshold.m_data + 2),0.0,1.0,0.5,-0.5);
  TriangleDerivateCase::getSurfaceThreshold((TriangleDerivateCase *)local_70);
  tcu::abs<float,4>((tcu *)&div,&(this->super_TriangleDerivateCase).m_derivScale);
  tcu::operator/((tcu *)(local_70 + 0x10),(Vector<float,_4> *)local_70,(Vector<float,_4> *)&div);
  if ((*(int *)&(this->super_TriangleDerivateCase).field_0xf4 == 0) ||
     (*(int *)&(this->super_TriangleDerivateCase).field_0xf4 == 1)) {
    bVar8 = *(int *)&(this->super_TriangleDerivateCase).field_0xf4 != 0;
    if (bVar8) {
      iVar2 = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)ctx);
    }
    else {
      iVar2 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)ctx);
    }
    local_77c = (float)iVar2;
    if (bVar8) {
      pVVar7 = &surfaceThreshold;
    }
    else {
      pVVar7 = &yScale;
    }
    local_788 = pVVar7->m_data + 2;
    pfVar5 = reference.m_data + 2;
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)pfVar5,(Vector<float,_4> *)local_788);
    a = &(this->super_TriangleDerivateCase).m_coordMax;
    pVVar7 = &(this->super_TriangleDerivateCase).m_coordMin;
    tcu::operator-((tcu *)(opThreshold.m_data + 2),a,pVVar7);
    tcu::operator/(local_b8,(Vector<float,_4> *)(opThreshold.m_data + 2),local_77c);
    tcu::operator*((tcu *)local_a8,(Vector<float,_4> *)local_b8,(Vector<float,_4> *)pfVar5);
    PVar1 = (this->super_TriangleDerivateCase).m_precision;
    tcu::operator*(local_e8,pVVar7,(Vector<float,_4> *)pfVar5);
    tcu::operator*((tcu *)(threshold.m_data + 2),a,(Vector<float,_4> *)pfVar5);
    getDerivateThreshold
              (local_d8,PVar1,(Vec4 *)local_e8,(Vec4 *)(threshold.m_data + 2),(Vec4 *)local_a8);
    tcu::max<float,4>((tcu *)local_108,(Vector<float,_4> *)(local_70 + 0x10),
                      (Vector<float,_4> *)local_d8);
    local_10c = glu::getDataTypeFloatScalars((this->super_TriangleDerivateCase).m_dataType);
    pTVar3 = tcu::TestContext::getLog
                       ((this->super_TriangleDerivateCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_290,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<(&local_290,(char (*) [25])"Verifying result image.\n");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [22])"\tValid derivative is ");
    anon_unknown_6::LogVecComps::LogVecComps(local_2b0,(Vec4 *)local_a8,local_10c);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,local_2b0);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [17])" with threshold ");
    anon_unknown_6::LogVecComps::LogVecComps(&local_2c0,(Vec4 *)local_108,local_10c);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_2c0);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_290);
    pTVar3 = tcu::TestContext::getLog
                       ((this->super_TriangleDerivateCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx);
    bVar8 = verifyConstantDerivate
                      (pTVar3,(ConstPixelBufferAccess *)ctx,(PixelBufferAccess *)sig,
                       (this->super_TriangleDerivateCase).m_dataType,(Vec4 *)local_a8,
                       (Vec4 *)local_108,&(this->super_TriangleDerivateCase).m_derivScale,
                       &(this->super_TriangleDerivateCase).m_derivBias,LOG_NOTHING);
    if (bVar8) {
      pTVar3 = tcu::TestContext::getLog
                         ((this->super_TriangleDerivateCase).super_TestCase.super_TestCase.
                          super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_440,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (&local_440,(char (*) [46])"No incorrect derivatives found, result valid.")
      ;
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_440);
      this_local._7_1_ = true;
      uVar6 = extraout_var;
    }
    else {
      pTVar3 = tcu::TestContext::getLog
                         ((this->super_TriangleDerivateCase).super_TestCase.super_TestCase.
                          super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)&viewportSize,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message)
      ;
      pMVar4 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)&viewportSize,
                          (char (*) [106])
                          "Initial verification failed, verifying image by calculating accurate error bounds for each result pixel.\n"
                         );
      pMVar4 = tcu::MessageBuilder::operator<<
                         (pMVar4,(char (*) [78])
                                 "\tVerifying each result derivative is within its range of legal result values."
                         );
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&viewportSize);
      TriangleDerivateCase::getViewportSize((TriangleDerivateCase *)&h);
      iVar2 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&h);
      fVar9 = (float)iVar2;
      iVar2 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&h);
      fVar10 = (float)iVar2;
      this_00 = (tcu *)(function.matrix.m_data.m_data[2].m_data + 2);
      tcu::operator-(this_00,&(this->super_TriangleDerivateCase).m_coordMax,
                     &(this->super_TriangleDerivateCase).m_coordMin);
      Linear2DFunctionEvaluator::Linear2DFunctionEvaluator((Linear2DFunctionEvaluator *)local_610);
      fVar11 = tcu::Vector<float,_4>::x((Vector<float,_4> *)this_00);
      pfVar5 = tcu::Vector<float,_4>::x(&(this->super_TriangleDerivateCase).m_coordMin);
      tcu::Vector<float,_3>::Vector(&local_61c,fVar11 / fVar9,0.0,*pfVar5);
      tcu::Matrix<float,_4,_3>::setRow((Matrix<float,_4,_3> *)local_610,0,&local_61c);
      fVar11 = tcu::Vector<float,_4>::y
                         ((Vector<float,_4> *)(function.matrix.m_data.m_data[2].m_data + 2));
      pfVar5 = tcu::Vector<float,_4>::y(&(this->super_TriangleDerivateCase).m_coordMin);
      tcu::Vector<float,_3>::Vector(&local_628,0.0,fVar11 / fVar10,*pfVar5);
      tcu::Matrix<float,_4,_3>::setRow((Matrix<float,_4,_3> *)local_610,1,&local_628);
      fVar12 = tcu::Vector<float,_4>::z
                         ((Vector<float,_4> *)(function.matrix.m_data.m_data[2].m_data + 2));
      fVar13 = tcu::Vector<float,_4>::z
                         ((Vector<float,_4> *)(function.matrix.m_data.m_data[2].m_data + 2));
      pfVar5 = tcu::Vector<float,_4>::z(&(this->super_TriangleDerivateCase).m_coordMin);
      fVar11 = *pfVar5;
      pfVar5 = tcu::Vector<float,_4>::z(&(this->super_TriangleDerivateCase).m_coordMin);
      tcu::Vector<float,_3>::Vector(&local_640,fVar12 / fVar9,fVar13 / fVar10,fVar11 + *pfVar5);
      tcu::operator/((tcu *)&local_634,&local_640,2.0);
      tcu::Matrix<float,_4,_3>::setRow((Matrix<float,_4,_3> *)local_610,2,&local_634);
      fVar12 = tcu::Vector<float,_4>::w
                         ((Vector<float,_4> *)(function.matrix.m_data.m_data[2].m_data + 2));
      fVar13 = tcu::Vector<float,_4>::w
                         ((Vector<float,_4> *)(function.matrix.m_data.m_data[2].m_data + 2));
      pfVar5 = tcu::Vector<float,_4>::w(&(this->super_TriangleDerivateCase).m_coordMax);
      fVar11 = *pfVar5;
      pfVar5 = tcu::Vector<float,_4>::w(&(this->super_TriangleDerivateCase).m_coordMax);
      tcu::Vector<float,_3>::Vector
                ((Vector<float,_3> *)&h_1,-fVar12 / fVar9,-fVar13 / fVar10,fVar11 + *pfVar5);
      tcu::operator/((tcu *)&local_64c,(Vector<float,_3> *)&h_1,2.0);
      tcu::Matrix<float,_4,_3>::setRow((Matrix<float,_4,_3> *)local_610,3,&local_64c);
      pTVar3 = tcu::TestContext::getLog
                         ((this->super_TriangleDerivateCase).super_TestCase.super_TestCase.
                          super_TestNode.m_testCtx);
      this_local._7_1_ =
           reverifyConstantDerivateWithFlushRelaxations
                     (pTVar3,(ConstPixelBufferAccess *)ctx,(PixelBufferAccess *)sig,
                      (this->super_TriangleDerivateCase).m_dataType,
                      (this->super_TriangleDerivateCase).m_precision,
                      &(this->super_TriangleDerivateCase).m_derivScale,
                      &(this->super_TriangleDerivateCase).m_derivBias,(Vec4 *)(local_70 + 0x10),
                      *(DerivateFunc *)&(this->super_TriangleDerivateCase).field_0xf4,
                      (Linear2DFunctionEvaluator *)local_610);
      Linear2DFunctionEvaluator::~Linear2DFunctionEvaluator((Linear2DFunctionEvaluator *)local_610);
      uVar6 = extraout_var_00;
    }
  }
  else {
    iVar2 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)ctx);
    dx.m_data[3] = (float)iVar2;
    iVar2 = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)ctx);
    dx.m_data[2] = (float)iVar2;
    tcu::operator-((tcu *)(dy.m_data + 2),&(this->super_TriangleDerivateCase).m_coordMax,
                   &(this->super_TriangleDerivateCase).m_coordMin);
    tcu::operator/((tcu *)&local_680,(Vector<float,_4> *)(dy.m_data + 2),dx.m_data[3]);
    tcu::operator*((tcu *)local_670,&local_680,(Vector<float,_4> *)(yScale.m_data + 2));
    tcu::operator-((tcu *)(reference_1.m_data + 2),&(this->super_TriangleDerivateCase).m_coordMax,
                   &(this->super_TriangleDerivateCase).m_coordMin);
    tcu::operator/((tcu *)&local_6b0,(Vector<float,_4> *)(reference_1.m_data + 2),dx.m_data[2]);
    tcu::operator*((tcu *)local_6a0,&local_6b0,(Vector<float,_4> *)(surfaceThreshold.m_data + 2));
    tcu::abs<float,4>((tcu *)&local_6e0,(Vector<float,_4> *)local_670);
    tcu::abs<float,4>((tcu *)(dxThreshold.m_data + 2),(Vector<float,_4> *)local_6a0);
    tcu::operator+((tcu *)local_6d0,&local_6e0,(Vector<float,_4> *)(dxThreshold.m_data + 2));
    PVar1 = (this->super_TriangleDerivateCase).m_precision;
    tcu::operator*((tcu *)&local_710,&(this->super_TriangleDerivateCase).m_coordMin,
                   (Vector<float,_4> *)(yScale.m_data + 2));
    tcu::operator*((tcu *)(dyThreshold.m_data + 2),&(this->super_TriangleDerivateCase).m_coordMax,
                   (Vector<float,_4> *)(yScale.m_data + 2));
    getDerivateThreshold
              ((Functional *)local_700,PVar1,&local_710,(Vec4 *)(dyThreshold.m_data + 2),
               (Vec4 *)local_670);
    PVar1 = (this->super_TriangleDerivateCase).m_precision;
    tcu::operator*((tcu *)&local_740,&(this->super_TriangleDerivateCase).m_coordMin,
                   (Vector<float,_4> *)(surfaceThreshold.m_data + 2));
    tcu::operator*((tcu *)(threshold_1.m_data + 2),&(this->super_TriangleDerivateCase).m_coordMax,
                   (Vector<float,_4> *)(surfaceThreshold.m_data + 2));
    getDerivateThreshold
              ((Functional *)local_730,PVar1,&local_740,(Vec4 *)(threshold_1.m_data + 2),
               (Vec4 *)local_6a0);
    tcu::max<float,4>((tcu *)&local_770,(Vector<float,_4> *)local_700,(Vector<float,_4> *)local_730)
    ;
    tcu::max<float,4>((tcu *)local_760,(Vector<float,_4> *)(local_70 + 0x10),&local_770);
    pTVar3 = tcu::TestContext::getLog
                       ((this->super_TriangleDerivateCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx);
    this_local._7_1_ =
         verifyConstantDerivate
                   (pTVar3,(ConstPixelBufferAccess *)ctx,(PixelBufferAccess *)sig,
                    (this->super_TriangleDerivateCase).m_dataType,(Vec4 *)local_6d0,
                    (Vec4 *)local_760,&(this->super_TriangleDerivateCase).m_derivScale,
                    &(this->super_TriangleDerivateCase).m_derivBias,LOG_ALL);
    uVar6 = extraout_var_01;
  }
  return (int)CONCAT71(uVar6,this_local._7_1_);
}

Assistant:

bool LinearDerivateCase::verify (const tcu::ConstPixelBufferAccess& result, const tcu::PixelBufferAccess& errorMask)
{
	const tcu::Vec4		xScale				= tcu::Vec4(1.0f, 0.0f, 0.5f, -0.5f);
	const tcu::Vec4		yScale				= tcu::Vec4(0.0f, 1.0f, 0.5f, -0.5f);
	const tcu::Vec4		surfaceThreshold	= getSurfaceThreshold() / abs(m_derivScale);

	if (m_func == DERIVATE_DFDX || m_func == DERIVATE_DFDY)
	{
		const bool			isX			= m_func == DERIVATE_DFDX;
		const float			div			= isX ? float(result.getWidth()) : float(result.getHeight());
		const tcu::Vec4		scale		= isX ? xScale : yScale;
		const tcu::Vec4		reference	= ((m_coordMax - m_coordMin) / div) * scale;
		const tcu::Vec4		opThreshold	= getDerivateThreshold(m_precision, m_coordMin*scale, m_coordMax*scale, reference);
		const tcu::Vec4		threshold	= max(surfaceThreshold, opThreshold);
		const int			numComps	= glu::getDataTypeFloatScalars(m_dataType);

		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Verifying result image.\n"
			<< "\tValid derivative is " << LogVecComps(reference, numComps) << " with threshold " << LogVecComps(threshold, numComps)
			<< tcu::TestLog::EndMessage;

		// short circuit if result is strictly within the normal value error bounds.
		// This improves performance significantly.
		if (verifyConstantDerivate(m_testCtx.getLog(), result, errorMask, m_dataType,
								   reference, threshold, m_derivScale, m_derivBias,
								   LOG_NOTHING))
		{
			m_testCtx.getLog()
				<< tcu::TestLog::Message
				<< "No incorrect derivatives found, result valid."
				<< tcu::TestLog::EndMessage;

			return true;
		}

		// some pixels exceed error bounds calculated for normal values. Verify that these
		// potentially invalid pixels are in fact valid due to (for example) subnorm flushing.

		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Initial verification failed, verifying image by calculating accurate error bounds for each result pixel.\n"
			<< "\tVerifying each result derivative is within its range of legal result values."
			<< tcu::TestLog::EndMessage;

		{
			const tcu::IVec2			viewportSize	= getViewportSize();
			const float					w				= float(viewportSize.x());
			const float					h				= float(viewportSize.y());
			const tcu::Vec4				valueRamp		= (m_coordMax - m_coordMin);
			Linear2DFunctionEvaluator	function;

			function.matrix.setRow(0, tcu::Vec3(valueRamp.x() / w, 0.0f, m_coordMin.x()));
			function.matrix.setRow(1, tcu::Vec3(0.0f, valueRamp.y() / h, m_coordMin.y()));
			function.matrix.setRow(2, tcu::Vec3(valueRamp.z() / w, valueRamp.z() / h, m_coordMin.z() + m_coordMin.z()) / 2.0f);
			function.matrix.setRow(3, tcu::Vec3(-valueRamp.w() / w, -valueRamp.w() / h, m_coordMax.w() + m_coordMax.w()) / 2.0f);

			return reverifyConstantDerivateWithFlushRelaxations(m_testCtx.getLog(), result, errorMask,
																m_dataType, m_precision, m_derivScale,
																m_derivBias, surfaceThreshold, m_func,
																function);
		}
	}
	else
	{
		DE_ASSERT(m_func == DERIVATE_FWIDTH);
		const float			w			= float(result.getWidth());
		const float			h			= float(result.getHeight());

		const tcu::Vec4		dx			= ((m_coordMax - m_coordMin) / w) * xScale;
		const tcu::Vec4		dy			= ((m_coordMax - m_coordMin) / h) * yScale;
		const tcu::Vec4		reference	= tcu::abs(dx) + tcu::abs(dy);
		const tcu::Vec4		dxThreshold	= getDerivateThreshold(m_precision, m_coordMin*xScale, m_coordMax*xScale, dx);
		const tcu::Vec4		dyThreshold	= getDerivateThreshold(m_precision, m_coordMin*yScale, m_coordMax*yScale, dy);
		const tcu::Vec4		threshold	= max(surfaceThreshold, max(dxThreshold, dyThreshold));

		return verifyConstantDerivate(m_testCtx.getLog(), result, errorMask, m_dataType,
									  reference, threshold, m_derivScale, m_derivBias);
	}
}